

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::Block2LevelUnsizedStructArrayCase::init
          (Block2LevelUnsizedStructArrayCase *this,EVP_PKEY_CTX *ctx)

{
  deUint32 *this_00;
  int size;
  int extraout_EAX;
  StructType *pSVar1;
  BufferBlock *pBVar2;
  int local_218;
  int local_1ac;
  int lastArrayLen;
  int ndx;
  Random rnd;
  VarType local_180;
  VarType local_168;
  BufferVar local_150;
  VarType local_110;
  BufferVar local_f8;
  VarType local_b8;
  BufferVar local_a0;
  BufferBlock *local_60;
  BufferBlock *block;
  VarType local_30;
  StructType *local_18;
  StructType *typeS;
  Block2LevelUnsizedStructArrayCase *this_local;
  
  typeS = (StructType *)this;
  pSVar1 = bb::ShaderInterface::allocStruct(&(this->super_SSBOLayoutCase).m_interface,"S");
  local_18 = pSVar1;
  glu::VarType::VarType(&local_30,TYPE_INT_VEC3,PRECISION_HIGHP);
  glu::StructType::addMember(pSVar1,"a",&local_30);
  glu::VarType::~VarType(&local_30);
  pSVar1 = local_18;
  glu::VarType::VarType((VarType *)&block,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(pSVar1,"c",(VarType *)&block);
  glu::VarType::~VarType((VarType *)&block);
  pBVar2 = bb::ShaderInterface::allocBlock(&(this->super_SSBOLayoutCase).m_interface,"Block");
  local_60 = pBVar2;
  glu::VarType::VarType(&local_b8,TYPE_UINT,PRECISION_LOWP);
  bb::BufferVar::BufferVar(&local_a0,"u",&local_b8,0);
  bb::BufferBlock::addMember(pBVar2,&local_a0);
  bb::BufferVar::~BufferVar(&local_a0);
  glu::VarType::~VarType(&local_b8);
  pBVar2 = local_60;
  glu::VarType::VarType(&local_110,TYPE_FLOAT_VEC4,PRECISION_MEDIUMP);
  bb::BufferVar::BufferVar(&local_f8,"v",&local_110,0x1000);
  bb::BufferBlock::addMember(pBVar2,&local_f8);
  bb::BufferVar::~BufferVar(&local_f8);
  glu::VarType::~VarType(&local_110);
  pBVar2 = local_60;
  this_00 = &rnd.m_rnd.z;
  glu::VarType::VarType((VarType *)this_00,local_18);
  glu::VarType::VarType(&local_180,(VarType *)this_00,2);
  glu::VarType::VarType(&local_168,&local_180,-1);
  bb::BufferVar::BufferVar(&local_150,"s",&local_168,0x1800);
  bb::BufferBlock::addMember(pBVar2,&local_150);
  bb::BufferVar::~BufferVar(&local_150);
  glu::VarType::~VarType(&local_168);
  glu::VarType::~VarType(&local_180);
  glu::VarType::~VarType((VarType *)&rnd.m_rnd.z);
  bb::BufferBlock::setFlags(local_60,this->m_layoutFlags);
  if (0 < this->m_numInstances) {
    bb::BufferBlock::setInstanceName(local_60,"block");
    bb::BufferBlock::setArraySize(local_60,this->m_numInstances);
  }
  de::Random::Random((Random *)&lastArrayLen,0x928);
  local_1ac = 0;
  while( true ) {
    if (this->m_numInstances == 0) {
      local_218 = 1;
    }
    else {
      local_218 = this->m_numInstances;
    }
    if (local_218 <= local_1ac) break;
    size = de::Random::getInt((Random *)&lastArrayLen,1,5);
    bb::BufferBlock::setLastUnsizedArraySize(local_60,local_1ac,size);
    local_1ac = local_1ac + 1;
  }
  de::Random::~Random((Random *)&lastArrayLen);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, glu::PRECISION_HIGHP));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP));

		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("u", VarType(glu::TYPE_UINT, glu::PRECISION_LOWP), 0 /* no access */));
		block.addMember(BufferVar("v", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_MEDIUMP), ACCESS_WRITE));
		block.addMember(BufferVar("s", VarType(VarType(VarType(&typeS), 2), VarType::UNSIZED_ARRAY), ACCESS_READ|ACCESS_WRITE));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}

		{
			de::Random rnd(2344);
			for (int ndx = 0; ndx < (m_numInstances ? m_numInstances : 1); ndx++)
			{
				const int lastArrayLen = rnd.getInt(1, 5);
				block.setLastUnsizedArraySize(ndx, lastArrayLen);
			}
		}
	}